

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O3

void Mips_printInst(MCInst *MI,SStream *O,void *info)

{
  char *pcVar1;
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar2;
  uint8_t *puVar3;
  char cVar4;
  byte bVar5;
  cs_detail *pcVar6;
  _Bool _Var7;
  uint uVar8;
  mips_reg Op;
  uint uVar9;
  uint uVar10;
  MCOperand *pMVar11;
  MCRegisterClass *pMVar12;
  int64_t iVar13;
  char *s;
  ulong uVar14;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *O_00;
  int opNum;
  char *pcVar15;
  SStream *in_R8;
  uint i;
  
  uVar8 = MCInst_getOpcode(MI);
  if (uVar8 - 0x582 < 2) {
    return;
  }
  if (uVar8 - 0x68b < 2) {
    return;
  }
  uVar8 = MCInst_getOpcode(MI);
  if ((int)uVar8 < 0x28d) {
    if ((int)uVar8 < 299) {
      switch(uVar8) {
      case 0xb0:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc0f $\x02";
LAB_002109ef:
            s = cs_strdup(pcVar15);
            for (pcVar15 = s; cVar4 = *pcVar15, cVar4 != '\0'; pcVar15 = pcVar15 + 1) {
              if ((cVar4 == ' ') || (cVar4 == '\t')) {
                *pcVar15 = '\0';
                pcVar15 = pcVar15 + 1;
                break;
              }
            }
            SStream_concat0(O,s);
            if (*pcVar15 != '\0') {
              SStream_concat0(O,anon_var_dwarf_326247 + 0x11);
              do {
                cVar4 = *pcVar15;
                if (cVar4 == '$') {
                  pcVar1 = pcVar15 + 1;
                  if (*pcVar1 == -1) {
                    pcVar15 = pcVar15 + 3;
                  }
                  else {
                    pcVar15 = pcVar15 + 1;
                    printOperand(MI,(int)*pcVar1 - 1,O);
                  }
                }
                else {
                  if (cVar4 == '\0') break;
                  SStream_concat(O,"%c",(ulong)(uint)(int)cVar4);
                }
                pcVar15 = pcVar15 + 1;
              } while( true );
            }
            if (s != (char *)0x0) goto LAB_00210d14;
          }
        }
        break;
      case 0xb1:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc0fl $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xb2:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc0t $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xb3:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc0tl $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xb4:
      case 0xb7:
      case 0xb8:
      case 0xbb:
      case 0xbc:
      case 0xbf:
        break;
      case 0xb5:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x9b) {
            pcVar15 = "bc1f $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xb6:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x9b) {
            pcVar15 = "bc1fl $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xb9:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x9b) {
            pcVar15 = "bc1t $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xba:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x9b) {
            pcVar15 = "bc1tl $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xbd:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc2f $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xbe:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc2fl $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xc0:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc2t $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xc1:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc2tl $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xc2:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc3f $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xc3:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc3fl $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xc4:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc3t $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      case 0xc5:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar15 = "bc3tl $\x02";
            goto LAB_002109ef;
          }
        }
        break;
      default:
        if ((uVar8 == 0x4d) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 3)) {
          pMVar11 = MCInst_getOperand(MI,0);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,0);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,1);
              _Var7 = MCOperand_isReg(pMVar11);
              if (_Var7) {
                pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar11 = MCInst_getOperand(MI,1);
                uVar8 = MCOperand_getReg(pMVar11);
                _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
                if (_Var7) {
                  pMVar11 = MCInst_getOperand(MI,2);
                  uVar8 = MCOperand_getReg(pMVar11);
                  if (uVar8 == 0x15) {
LAB_00210167:
                    pcVar15 = "move $\x01, $\x02";
                    goto LAB_002109ef;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 299) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 2) {
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar11);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,0);
          iVar13 = MCOperand_getImm(pMVar11);
          if (iVar13 == 0) {
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isImm(pMVar11);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,1);
              iVar13 = MCOperand_getImm(pMVar11);
              if (iVar13 == 0) {
                pcVar15 = "break";
                goto LAB_002109ef;
              }
            }
          }
        }
      }
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 2) {
        pMVar11 = MCInst_getOperand(MI,1);
        _Var7 = MCOperand_isImm(pMVar11);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          iVar13 = MCOperand_getImm(pMVar11);
          if (iVar13 == 0) {
            pcVar15 = "break $\x01";
            goto LAB_002109ef;
          }
        }
      }
    }
    else if (uVar8 == 0x222) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar11);
        if (_Var7) {
          pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x23);
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x23);
              pMVar11 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar11);
              _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                uVar8 = MCOperand_getReg(pMVar11);
                if (uVar8 == 0x14b) goto LAB_00210167;
              }
            }
          }
        }
      }
    }
    else if ((uVar8 == 0x233) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 1)) {
      pMVar11 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar11);
      if (uVar8 == 0x15) {
        pcVar15 = "di";
        goto LAB_002109ef;
      }
    }
  }
  else if ((int)uVar8 < 0x666) {
    if ((int)uVar8 < 0x598) {
      if ((int)uVar8 < 0x37b) {
        if (uVar8 == 0x28d) {
          uVar8 = MCInst_getNumOperands(MI);
          if (uVar8 == 1) {
            pMVar11 = MCInst_getOperand(MI,0);
            uVar8 = MCOperand_getReg(pMVar11);
            if (uVar8 == 0x15) {
              pcVar15 = "ei";
              goto LAB_002109ef;
            }
          }
        }
        else if ((uVar8 == 0x379) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 2)) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x15) {
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              uVar8 = 8;
              goto LAB_002101c6;
            }
          }
        }
      }
      else if (uVar8 == 0x37b) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x14b) {
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              uVar8 = 0x23;
LAB_002101c6:
              pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,uVar8);
              pMVar11 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar11);
              _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
              if (_Var7) {
                pcVar15 = "jr $\x02";
                goto LAB_002109ef;
              }
            }
          }
        }
      }
      else if (uVar8 == 0x380) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x13) {
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar11 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar11);
              _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
              if (_Var7) {
                pcVar15 = "jalr.hb $\x02";
                goto LAB_002109ef;
              }
            }
          }
        }
      }
      else if ((uVar8 == 0x469) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 2)) {
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x15) {
          pMVar11 = MCInst_getOperand(MI,1);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x15) {
LAB_00210825:
            pcVar15 = "nop";
            goto LAB_002109ef;
          }
        }
      }
    }
    else if ((int)uVar8 < 0x5e1) {
      if (uVar8 == 0x598) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 1) {
          pMVar11 = MCInst_getOperand(MI,0);
          _Var7 = MCOperand_isImm(pMVar11);
          if (_Var7) goto LAB_002104f9;
        }
      }
      else if ((uVar8 == 0x59b) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 1)) {
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar11);
        if (_Var7) {
LAB_002104f9:
          pMVar11 = MCInst_getOperand(MI,0);
          iVar13 = MCOperand_getImm(pMVar11);
          if (iVar13 == 0) {
            pcVar15 = "sdbbp";
            goto LAB_002109ef;
          }
        }
      }
    }
    else if (uVar8 == 0x5e1) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x15) {
          pMVar11 = MCInst_getOperand(MI,1);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x15) {
            pMVar11 = MCInst_getOperand(MI,2);
            _Var7 = MCOperand_isImm(pMVar11);
            if (_Var7) {
LAB_00210807:
              pMVar11 = MCInst_getOperand(MI,2);
              iVar13 = MCOperand_getImm(pMVar11);
              if (iVar13 == 0) goto LAB_00210825;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x5ee) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x15) {
          pMVar11 = MCInst_getOperand(MI,1);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x15) {
            pMVar11 = MCInst_getOperand(MI,2);
            _Var7 = MCOperand_isImm(pMVar11);
            if (_Var7) goto LAB_00210807;
          }
        }
      }
    }
    else if ((uVar8 == 0x63e) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 3)) {
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar11);
      if (_Var7) {
        pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x15) {
            pMVar11 = MCInst_getOperand(MI,2);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar11 = MCInst_getOperand(MI,2);
              uVar8 = MCOperand_getReg(pMVar11);
              _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
              if (_Var7) {
                pcVar15 = "neg $\x01, $\x03";
                goto LAB_002109ef;
              }
            }
          }
        }
      }
    }
  }
  else if ((int)uVar8 < 0x6bf) {
    if ((int)uVar8 < 0x684) {
      if (uVar8 == 0x666) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 3) {
          pMVar11 = MCInst_getOperand(MI,0);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,0);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar11);
              if (uVar8 == 0x15) {
                pMVar11 = MCInst_getOperand(MI,2);
                _Var7 = MCOperand_isReg(pMVar11);
                if (_Var7) {
                  pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                  pMVar11 = MCInst_getOperand(MI,2);
                  uVar8 = MCOperand_getReg(pMVar11);
                  _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
                  if (_Var7) {
                    pcVar15 = "negu $\x01, $\x03";
                    goto LAB_002109ef;
                  }
                }
              }
            }
          }
        }
      }
      else if ((uVar8 == 0x681) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 1)) {
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar11);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,0);
          iVar13 = MCOperand_getImm(pMVar11);
          if (iVar13 == 0) {
            pcVar15 = "sync";
            goto LAB_002109ef;
          }
        }
      }
    }
    else if (uVar8 == 0x684) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 1) {
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar11);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,0);
          iVar13 = MCOperand_getImm(pMVar11);
          if (iVar13 == 0) {
            pcVar15 = "syscall";
            goto LAB_002109ef;
          }
        }
      }
    }
    else if (uVar8 == 0x6b6) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar11);
        if (_Var7) {
          pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar11 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar11);
              _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                _Var7 = MCOperand_isImm(pMVar11);
                if (_Var7) {
                  pMVar11 = MCInst_getOperand(MI,2);
                  iVar13 = MCOperand_getImm(pMVar11);
                  if (iVar13 == 0) {
                    pcVar15 = "teq $\x01, $\x02";
                    goto LAB_002109ef;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if ((uVar8 == 0x6ba) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 3)) {
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar11);
      if (_Var7) {
        pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isImm(pMVar11);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                iVar13 = MCOperand_getImm(pMVar11);
                if (iVar13 == 0) {
                  pcVar15 = "tge $\x01, $\x02";
                  goto LAB_002109ef;
                }
              }
            }
          }
        }
      }
    }
  }
  else if ((int)uVar8 < 0x6ce) {
    if (uVar8 == 0x6bf) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 == 3) {
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar11);
        if (_Var7) {
          pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar11 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar11);
              _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                _Var7 = MCOperand_isImm(pMVar11);
                if (_Var7) {
                  pMVar11 = MCInst_getOperand(MI,2);
                  iVar13 = MCOperand_getImm(pMVar11);
                  if (iVar13 == 0) {
                    pcVar15 = "tgeu $\x01, $\x02";
                    goto LAB_002109ef;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if ((uVar8 == 0x6ca) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 3)) {
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar11);
      if (_Var7) {
        pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isImm(pMVar11);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                iVar13 = MCOperand_getImm(pMVar11);
                if (iVar13 == 0) {
                  pcVar15 = "tlt $\x01, $\x02";
                  goto LAB_002109ef;
                }
              }
            }
          }
        }
      }
    }
  }
  else if (uVar8 == 0x6ce) {
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 3) {
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar11);
      if (_Var7) {
        pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isImm(pMVar11);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                iVar13 = MCOperand_getImm(pMVar11);
                if (iVar13 == 0) {
                  pcVar15 = "tltu $\x01, $\x02";
                  goto LAB_002109ef;
                }
              }
            }
          }
        }
      }
    }
  }
  else if (uVar8 == 0x6d1) {
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 == 3) {
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar11);
      if (_Var7) {
        pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isImm(pMVar11);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                iVar13 = MCOperand_getImm(pMVar11);
                if (iVar13 == 0) {
                  pcVar15 = "tne $\x01, $\x02";
                  goto LAB_002109ef;
                }
              }
            }
          }
        }
      }
    }
  }
  else if ((uVar8 == 0x6e8) && (uVar8 = MCInst_getNumOperands(MI), uVar8 == 1)) {
    pMVar11 = MCInst_getOperand(MI,0);
    _Var7 = MCOperand_isImm(pMVar11);
    if (_Var7) {
      pMVar11 = MCInst_getOperand(MI,0);
      iVar13 = MCOperand_getImm(pMVar11);
      if (iVar13 == 0) {
        pcVar15 = "wait";
        goto LAB_002109ef;
      }
    }
  }
  uVar8 = MCInst_getOpcode(MI);
  if ((int)uVar8 < 0x112) {
    if ((int)uVar8 < 0xcf) {
      if (uVar8 == 0xb5) {
        _Var7 = isReg(MI,0,0x9b);
        if (_Var7) {
          pcVar15 = "bc1f";
LAB_00210cfc:
          uVar8 = 1;
LAB_00210d04:
          s = printAlias1(pcVar15,MI,uVar8,O);
          goto LAB_00210d0c;
        }
      }
      else if (uVar8 == 0xb9) {
        _Var7 = isReg(MI,0,0x9b);
        if (_Var7) {
          pcVar15 = "bc1t";
          goto LAB_00210cfc;
        }
      }
      else if (uVar8 == 0xce) goto LAB_00210b1e;
    }
    else if ((int)uVar8 < 0xdb) {
      if (uVar8 == 0xcf) {
        uVar8 = 0x14b;
      }
      else {
        if (uVar8 != 0xd6) goto LAB_00210d40;
LAB_00210b1e:
        _Var7 = isReg(MI,0,0x15);
        if ((_Var7) && (_Var7 = isReg(MI,1,0x15), _Var7)) {
          pcVar15 = "b";
          uVar8 = 2;
          goto LAB_00210d04;
        }
        uVar8 = 0x15;
      }
      _Var7 = isReg(MI,1,uVar8);
      if (_Var7) {
        pcVar15 = "beqz";
LAB_00210cb4:
        uVar8 = 2;
        goto LAB_00210cbc;
      }
    }
    else if (uVar8 == 0xdb) {
      _Var7 = isReg(MI,0,0x15);
      if (_Var7) {
        pcVar15 = "bal";
        goto LAB_00210cfc;
      }
    }
    else if (uVar8 == 0x111) {
      uVar8 = 0x15;
      goto LAB_00210ca0;
    }
  }
  else {
    if ((int)uVar8 < 0x4fa) {
      if (uVar8 == 0x112) {
        uVar8 = 0x14b;
LAB_00210ca0:
        _Var7 = isReg(MI,1,uVar8);
        if (_Var7) {
          pcVar15 = "bnez";
          goto LAB_00210cb4;
        }
      }
      else {
        if (uVar8 == 0x379) {
          uVar8 = 0x13;
        }
        else {
          if (uVar8 != 0x37b) goto LAB_00210d40;
          uVar8 = 0x115;
        }
        _Var7 = isReg(MI,0,uVar8);
        if (_Var7) {
          pcVar15 = "jalr";
          goto LAB_00210cfc;
        }
      }
      goto LAB_00210d40;
    }
    if ((int)uVar8 < 0x4fd) {
      if (uVar8 == 0x4fa) {
LAB_00210bf0:
        uVar8 = 0x15;
      }
      else {
        if (uVar8 != 0x4fb) goto LAB_00210d40;
        uVar8 = 0x14b;
      }
      _Var7 = isReg(MI,2,uVar8);
      if (!_Var7) goto LAB_00210d40;
      pcVar15 = "not";
    }
    else {
      if (uVar8 == 0x4fd) goto LAB_00210bf0;
      if ((uVar8 != 0x505) || (_Var7 = isReg(MI,2,0x15), !_Var7)) goto LAB_00210d40;
      pcVar15 = "move";
    }
    uVar8 = 1;
LAB_00210cbc:
    s = printAlias2(pcVar15,MI,uVar8,(uint)O,in_R8);
LAB_00210d0c:
    if (s != (char *)0x0) {
LAB_00210d14:
      Op = Mips_map_insn(s);
      MCInst_setOpcodePub(MI,Op);
      (*cs_mem_free)(s);
      return;
    }
  }
LAB_00210d40:
  uVar8 = MCInst_getOpcode(MI);
  uVar8 = *(uint *)(printInstruction_OpInfo + (ulong)uVar8 * 4);
  uVar9 = MCInst_getOpcode(MI);
  bVar5 = printInstruction_OpInfo2[uVar9];
  SStream_concat0(O,&UNK_003acbef + (uVar8 & 0x3fff));
  switch(uVar8 >> 0xe & 0xf) {
  case 1:
    uVar9 = 0;
    break;
  case 2:
    uVar9 = 1;
    goto LAB_00210f02;
  case 3:
    uVar9 = 2;
LAB_00210f02:
    printOperand(MI,uVar9,O);
    pcVar15 = ", ";
LAB_00210fbb:
    SStream_concat0(O,pcVar15);
    goto LAB_00210fc3;
  case 4:
    printUnsignedImm8(MI,0,O);
    return;
  case 5:
    printUnsignedImm(MI,2,O);
    SStream_concat0(O,", ");
  case 9:
    opNum = 0;
    goto LAB_00211158;
  case 6:
    pMVar11 = MCInst_getOperand(MI,2);
    uVar14 = MCOperand_getImm(pMVar11);
    if ((uVar14 & 0xffffffe0) == 0) {
      pcVar15 = &DAT_003af104 + *(int *)(&DAT_003af104 + (ulong)((uint)uVar14 & 0x1f) * 4);
    }
    else {
      pcVar15 = (char *)0x0;
    }
    goto LAB_00210fbb;
  case 7:
    uVar9 = MCInst_getNumOperands(MI);
    if (uVar9 != 2) {
      i = 0;
      do {
        if (i != 0) {
          SStream_concat0(O,", ");
        }
        pMVar11 = MCInst_getOperand(MI,i);
        uVar10 = MCOperand_getReg(pMVar11);
        SStream_concat(O,"$%s",&getRegisterName_AsmStrs +
                               *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar10 - 1) * 2));
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar6 = MI->flat_insn->detail;
          puVar3 = pcVar6->groups + (ulong)(pcVar6->field_6).x86.prefix[0] * 0x18 + 0x15;
          puVar3[0] = '\x01';
          puVar3[1] = '\0';
          puVar3[2] = '\0';
          puVar3[3] = '\0';
          pcVar6 = MI->flat_insn->detail;
          *(uint *)(pcVar6->groups + (ulong)(pcVar6->field_6).x86.prefix[0] * 0x18 + 0x1d) = uVar10;
          paVar2 = &MI->flat_insn->detail->field_6;
          (paVar2->x86).prefix[0] = (paVar2->x86).prefix[0] + '\x01';
        }
        i = i + 1;
      } while (uVar9 - 2 != i);
    }
    SStream_concat0(O,", ");
    goto LAB_00210fc3;
  case 8:
    pMVar11 = MCInst_getOperand(MI,0);
    uVar8 = MCOperand_getReg(pMVar11);
    SStream_concat(O,"$%s",&getRegisterName_AsmStrs +
                           *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar8 - 1) * 2));
    SStream_concat0(O,", ");
    goto switchD_00210fe7_caseD_f;
  case 10:
    uVar9 = 3;
    break;
  default:
    goto switchD_00210dad_default;
  }
  printOperand(MI,uVar9,O);
LAB_00210fc3:
  switch(uVar8 >> 0x12 & 0x1f) {
  case 1:
    printOperand(MI,2,O);
    O_00 = extraout_RDX;
    goto LAB_002110fa;
  case 2:
    goto switchD_00210dad_default;
  case 3:
    goto switchD_00210fe7_caseD_3;
  case 4:
    pcVar15 = ", $pc, ";
    goto LAB_002110d6;
  case 5:
    pcVar15 = " # 16 bit inst";
    break;
  case 6:
    goto switchD_00210fe7_caseD_6;
  case 7:
    goto switchD_00210fe7_caseD_7;
  case 8:
    pcVar15 = ".d\t";
    goto LAB_002110ba;
  case 9:
    pcVar15 = ".s\t";
LAB_002110ba:
    SStream_concat0(O,pcVar15);
    printOperand(MI,0,O);
    pcVar15 = ", ";
LAB_002110d6:
    SStream_concat0(O,pcVar15);
switchD_00210fe7_caseD_3:
    uVar8 = 1;
LAB_002112b2:
    printOperand(MI,uVar8,O);
    return;
  case 10:
    pcVar15 = ", [";
    goto LAB_002110f2;
  case 0xb:
    pcVar15 = "\n\tnop";
    break;
  case 0xc:
    pcVar15 = "\t# branch\n\tnop";
    break;
  case 0xd:
    goto switchD_00210fe7_caseD_d;
  case 0xe:
    SStream_concat0(O,", 1f\n\tb\t2f\n\t.align\t2\n1: \t.word\t");
    printOperand(MI,1,O);
    pcVar15 = "\n2:";
    break;
  case 0xf:
switchD_00210fe7_caseD_f:
    opNum = 2;
    goto LAB_00211158;
  case 0x10:
    pcVar15 = ", .+4\n\t\n\tmove ";
    goto LAB_00211036;
  default:
    pcVar15 = "  , ";
LAB_002110f2:
    SStream_concat0(O,pcVar15 + 2);
    O_00 = extraout_RDX_00;
LAB_002110fa:
    switch(uVar8 >> 0x17 & 0xf) {
    case 1:
      goto switchD_00210dad_default;
    case 2:
      goto switchD_0021111e_caseD_2;
    case 3:
      printMemOperandEA(MI,(uint)O,O_00);
      return;
    case 4:
      printUnsignedImm(MI,1,O);
      pcVar15 = ", ";
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00210dad_default;
      case 1:
        goto switchD_002112f6_caseD_1;
      case 2:
        goto switchD_002112f6_caseD_2;
      case 3:
        goto switchD_00210fe7_caseD_6;
      case 4:
        goto switchD_002112f6_caseD_4;
      case 5:
        goto switchD_002112f6_caseD_5;
      case 6:
        goto switchD_002112f6_caseD_6;
      case 7:
        goto switchD_002112f6_caseD_7;
      case 8:
        goto switchD_002112f6_caseD_8;
      case 9:
        goto switchD_002112f6_caseD_9;
      case 10:
        goto switchD_002112f6_caseD_a;
      case 0xb:
        goto switchD_002112f6_caseD_b;
      case 0xc:
        goto switchD_002112f6_caseD_c;
      case 0xd:
        goto switchD_002112f6_caseD_d;
      case 0xe:
        goto switchD_002112f6_caseD_e;
      }
    case 5:
      printUnsignedImm(MI,3,O);
      pcVar15 = "], ";
      goto LAB_00211055;
    case 6:
      printUnsignedImm(MI,2,O);
      SStream_concat0(O,"], ");
      printOperand(MI,3,O);
      SStream_concat0(O,"[");
      printUnsignedImm(MI,4,O);
      goto switchD_00211511_caseD_2;
    case 7:
switchD_00210fe7_caseD_d:
      opNum = 1;
LAB_00211158:
      printMemOperand(MI,opNum,O);
      return;
    case 8:
      SStream_concat0(O,", ");
      goto LAB_00211212;
    case 9:
      SStream_concat0(O,"\n\tmflo\t");
switchD_00210fe7_caseD_7:
      uVar8 = 0;
      goto LAB_002112b2;
    case 10:
      printOperand(MI,4,O);
      pcVar15 = ", ";
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00210dad_default;
      case 1:
        goto switchD_002112f6_caseD_1;
      case 2:
        goto switchD_002112f6_caseD_2;
      case 3:
        goto switchD_00210fe7_caseD_6;
      case 4:
        goto switchD_002112f6_caseD_4;
      case 5:
        goto switchD_002112f6_caseD_5;
      case 6:
        goto switchD_002112f6_caseD_6;
      case 7:
        goto switchD_002112f6_caseD_7;
      case 8:
        goto switchD_002112f6_caseD_8;
      case 9:
        goto switchD_002112f6_caseD_9;
      case 10:
        goto switchD_002112f6_caseD_a;
      case 0xb:
        goto switchD_002112f6_caseD_b;
      case 0xc:
        goto switchD_002112f6_caseD_c;
      case 0xd:
        goto switchD_002112f6_caseD_d;
      case 0xe:
        goto switchD_002112f6_caseD_e;
      }
    case 0xb:
      SStream_concat0(O,"\n\tmove\t");
      printOperand(MI,0,O);
      pcVar15 = ", $t8";
      break;
    default:
      printOperand(MI,1,O);
      pcVar15 = ", ";
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00210dad_default;
      case 1:
        goto switchD_002112f6_caseD_1;
      case 2:
        goto switchD_002112f6_caseD_2;
      case 3:
        goto switchD_00210fe7_caseD_6;
      case 4:
        goto switchD_002112f6_caseD_4;
      case 5:
        goto switchD_002112f6_caseD_5;
      case 6:
        goto switchD_002112f6_caseD_6;
      case 7:
        goto switchD_002112f6_caseD_7;
      case 8:
        goto switchD_002112f6_caseD_8;
      case 9:
        goto switchD_002112f6_caseD_9;
      case 10:
        goto switchD_002112f6_caseD_a;
      case 0xb:
        goto switchD_002112f6_caseD_b;
      case 0xc:
        goto switchD_002112f6_caseD_c;
      case 0xd:
        goto switchD_002112f6_caseD_d;
      case 0xe:
        goto switchD_002112f6_caseD_e;
      }
    }
  }
LAB_00211308:
  SStream_concat0(O,pcVar15);
  return;
switchD_0021111e_caseD_2:
  printOperand(MI,2,O);
  pcVar15 = ", ";
  switch(uVar8 >> 0x1b & 0xf) {
  default:
    goto switchD_00210dad_default;
  case 1:
    goto switchD_002112f6_caseD_1;
  case 2:
switchD_002112f6_caseD_2:
    pcVar15 = "\t# 16 bit inst";
    goto LAB_00211308;
  case 3:
switchD_00210fe7_caseD_6:
    pcVar15 = "  # 16 bit inst";
    goto LAB_00211308;
  case 4:
switchD_002112f6_caseD_4:
    pcVar15 = "\n\tbteqz\t";
    break;
  case 5:
switchD_002112f6_caseD_5:
    pcVar15 = "\n\tbtnez\t";
    break;
  case 6:
switchD_002112f6_caseD_6:
    pcVar15 = "[";
    goto switchD_002112f6_caseD_1;
  case 7:
switchD_002112f6_caseD_7:
    pcVar15 = " \t# 16 bit inst";
    goto LAB_00211308;
  case 8:
switchD_002112f6_caseD_8:
    pcVar15 = ", 32";
    goto LAB_00211308;
  case 9:
switchD_002112f6_caseD_9:
    SStream_concat0(O,"\n\taddiu\t");
    printOperand(MI,1,O);
    SStream_concat0(O,", $pc, ");
    printOperand(MI,3,O);
    pcVar15 = "\n ";
    goto LAB_00211308;
  case 10:
switchD_002112f6_caseD_a:
    SStream_concat0(O,"(");
    printOperand(MI,1,O);
    pcVar15 = ")";
    goto LAB_00211308;
  case 0xb:
switchD_002112f6_caseD_b:
    SStream_concat0(O," ( ");
    printOperand(MI,1,O);
    pcVar15 = " ); ";
    goto LAB_00211308;
  case 0xc:
switchD_002112f6_caseD_c:
    pcVar15 = ", 0";
    goto LAB_00211308;
  case 0xd:
switchD_002112f6_caseD_d:
    pcVar15 = "\n\tbteqz\t.+4\n\tmove ";
    goto LAB_00211036;
  case 0xe:
switchD_002112f6_caseD_e:
    pcVar15 = "\n\tbtnez\t.+4\n\tmove ";
LAB_00211036:
    SStream_concat0(O,pcVar15);
    printOperand(MI,1,O);
    pcVar15 = ", ";
  }
LAB_00211055:
  SStream_concat0(O,pcVar15);
  uVar8 = 2;
  goto LAB_002112b2;
switchD_002112f6_caseD_1:
  SStream_concat0(O,pcVar15);
  switch((uint)(CONCAT14(bVar5,uVar8) >> 0x1f) & 7) {
  case 1:
    break;
  case 2:
    printUnsignedImm(MI,2,O);
    switch(bVar5 >> 2 & 3) {
    default:
      goto switchD_00210dad_default;
    case 1:
      goto switchD_00211511_caseD_1;
    case 2:
      goto switchD_00211511_caseD_2;
    }
  case 3:
    printUnsignedImm8(MI,3,O);
    switch(bVar5 >> 2 & 3) {
    default:
      goto switchD_00210dad_default;
    case 1:
      goto switchD_00211511_caseD_1;
    case 2:
      goto switchD_00211511_caseD_2;
    }
  case 4:
    printOperand(MI,3,O);
    switch(bVar5 >> 2 & 3) {
    default:
      goto switchD_00210dad_default;
    case 1:
      goto switchD_00211511_caseD_1;
    case 2:
      goto switchD_00211511_caseD_2;
    }
  default:
    printOperand(MI,2,O);
    switch(bVar5 >> 2 & 3) {
    default:
      goto switchD_00210dad_default;
    case 1:
      goto switchD_00211511_caseD_1;
    case 2:
      goto switchD_00211511_caseD_2;
    }
  }
  printUnsignedImm8(MI,2,O);
  switch(bVar5 >> 2 & 3) {
  default:
switchD_00210dad_default:
    return;
  case 1:
switchD_00211511_caseD_1:
    SStream_concat0(O,", ");
    if ((bVar5 & 0x10) == 0) {
      printUnsignedImm(MI,3,O);
      return;
    }
LAB_00211212:
    uVar8 = 3;
    break;
  case 2:
switchD_00211511_caseD_2:
    pcVar15 = "]";
    goto LAB_00211308;
  }
  goto LAB_002112b2;
}

Assistant:

void Mips_printInst(MCInst *MI, SStream *O, void *info)
{
	char *mnem;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case Mips_Save16:
		case Mips_SaveX16:
		case Mips_Restore16:
		case Mips_RestoreX16:
			return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, info);
	if (!mnem) {
		mnem = printAlias(MI, O);
		if (!mnem) {
			printInstruction(MI, O, NULL);
		}
	}

	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		MCInst_setOpcodePub(MI, Mips_map_insn(mnem));
		cs_mem_free(mnem);
	}
}